

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

ssize_t __thiscall Buffer::write(Buffer *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 in_register_00000034;
  ofstream file;
  int aiStack_1f8 [120];
  
  std::ofstream::ofstream(&file,*(char **)CONCAT44(in_register_00000034,__fd),_S_trunc|_S_bin);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(_file + -0x18));
  if (iVar1 == 0) {
    std::ostream::write((char *)&file,(long)this->data);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&file);
  return CONCAT71((int7)((ulong)this >> 8),iVar1 == 0) & 0xffffffff;
}

Assistant:

bool
Buffer::write(const std::string &path) {
  std::ofstream file(path.c_str(), std::ios::binary | std::ios::trunc);
  if (!file.good()) {
    return false;
  }

  file.write(reinterpret_cast<char*>(data), size);
  file.close();

  return true;
}